

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

bool __thiscall ON_Xform::IsZeroTransformation(ON_Xform *this,double tol)

{
  bool bVar1;
  ulong uVar2;
  double (*padVar3) [4];
  ulong uVar4;
  bool bVar5;
  
  bVar1 = true;
  uVar2 = 0;
  padVar3 = (double (*) [4])this;
  do {
    if (bVar1 != false) {
      uVar4 = 0;
      do {
        if (uVar4 != 3 || uVar2 != 3) {
          bVar1 = ABS((*(double (*) [4])*padVar3)[uVar4]) <= tol;
        }
      } while ((bVar1 != false) && (bVar5 = uVar4 < 3, uVar4 = uVar4 + 1, bVar5));
    }
    if (bVar1 == false) break;
    padVar3 = padVar3 + 1;
    bVar5 = uVar2 < 3;
    uVar2 = uVar2 + 1;
  } while (bVar5);
  return (bool)(bVar1 & this->m_xform[3][3] == 1.0);
}

Assistant:

bool ON_Xform::IsZeroTransformation(double tol) const
{
	bool rc = true;
	for(int i=0; rc && i<4; i++)
		for (int j = 0; rc && j < 4; j++)
		{
			if (i == 3 && j == 3)
				continue;
			rc = fabs(m_xform[i][j]) <= tol;
		}
  return (rc && 1.0 == m_xform[3][3] );
}